

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleNameNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  pointer ppaVar1;
  pointer ppaVar2;
  Value *this_00;
  char *pcVar3;
  mapped_type *pmVar4;
  DeadlyImportError *pDVar5;
  string name;
  aiString aiName;
  
  if (this->m_currentNode == (aiNode *)0x0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&aiName,"No current node for name.",(allocator *)&name);
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)&aiName);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = ODDLParser::DDLNode::getValue(node);
  if (this_00 != (Value *)0x0) {
    if (this_00->m_type != ddl_string) {
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&aiName,"OpenGEX: invalid data type for value in node name.",
                 (allocator *)&name);
      DeadlyImportError::DeadlyImportError(pDVar5,(string *)&aiName);
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar3 = ODDLParser::Value::getString(this_00);
    std::__cxx11::string::string((string *)&name,pcVar3,(allocator *)&aiName);
    if (this->m_tokenType - 5U < 3) {
      aiString::Set(&this->m_currentNode->mName,name._M_dataplus._M_p);
    }
    else if (this->m_tokenType == 0xf) {
      aiName.length = 0;
      aiName.data[0] = '\0';
      memset(aiName.data + 1,0x1b,0x3ff);
      if (name._M_string_length < 0x400) {
        aiName.length = (ai_uint32)name._M_string_length;
        memcpy(aiName.data,name._M_dataplus._M_p,name._M_string_length);
        aiName.data[name._M_string_length] = '\0';
      }
      aiMaterial::AddProperty(this->m_currentMaterial,&aiName,"?mat.name",0,0);
      ppaVar1 = (this->m_materialCache).
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppaVar2 = (this->m_materialCache).
                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->m_material2refMap,&name);
      *pmVar4 = ((long)ppaVar2 - (long)ppaVar1 >> 3) - 1;
    }
    std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void OpenGEXImporter::handleNameNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No current node for name." );
        return;
    }

    Value *val( node->getValue() );
    if( nullptr != val ) {
        if( Value::ddl_string != val->m_type ) {
            throw DeadlyImportError( "OpenGEX: invalid data type for value in node name." );
            return;
        }

        const std::string name( val->getString() );
        if( m_tokenType == Grammar::GeometryNodeToken || m_tokenType == Grammar::LightNodeToken
                || m_tokenType == Grammar::CameraNodeToken ) {
            m_currentNode->mName.Set( name.c_str() );
        } else if( m_tokenType == Grammar::MaterialToken ) {
            aiString aiName;
            aiName.Set( name );
            m_currentMaterial->AddProperty( &aiName, AI_MATKEY_NAME );
            m_material2refMap[ name ] = m_materialCache.size() - 1;
        }
    }
}